

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox.h
# Opt level: O0

void __thiscall CS248::BBox::expand(BBox *this,Vector3D *p)

{
  double *pdVar1;
  double *in_RSI;
  Vector3D *in_RDI;
  Vector3D *in_stack_ffffffffffffffd8;
  double local_20;
  double local_18;
  
  pdVar1 = std::min<double>(&in_RDI[1].x,in_RSI);
  in_RDI[1].x = *pdVar1;
  pdVar1 = std::min<double>(&in_RDI[1].y,in_RSI + 1);
  in_RDI[1].y = *pdVar1;
  pdVar1 = std::min<double>(&in_RDI[1].z,in_RSI + 2);
  in_RDI[1].z = *pdVar1;
  pdVar1 = std::max<double>(&in_RDI->x,in_RSI);
  in_RDI->x = *pdVar1;
  pdVar1 = std::max<double>(&in_RDI->y,in_RSI + 1);
  in_RDI->y = *pdVar1;
  pdVar1 = std::max<double>(&in_RDI->z,in_RSI + 2);
  in_RDI->z = *pdVar1;
  Vector3D::operator-(in_stack_ffffffffffffffd8,in_RDI);
  in_RDI[2].x = (double)in_stack_ffffffffffffffd8;
  in_RDI[2].y = local_20;
  in_RDI[2].z = local_18;
  return;
}

Assistant:

void expand(const Vector3D &p) {
    min.x = std::min(min.x, p.x);
    min.y = std::min(min.y, p.y);
    min.z = std::min(min.z, p.z);
    max.x = std::max(max.x, p.x);
    max.y = std::max(max.y, p.y);
    max.z = std::max(max.z, p.z);
    extent = max - min;
  }